

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::CaseCheck>
          (Serializer *this,vector<duckdb::CaseCheck,_true> *vec)

{
  pointer pCVar1;
  CaseCheck *item;
  pointer value;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>).
                        super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>).
                        super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4);
  pCVar1 = (vec->super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>).
           super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (value = (vec->super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>).
               super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
               super__Vector_impl_data._M_start; value != pCVar1; value = value + 1) {
    WriteValue<duckdb::CaseCheck>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}